

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t __n;
  ulong uVar1;
  int iVar2;
  function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *pfVar3;
  size_type sVar4;
  reference this;
  ulong local_d8;
  size_t i_1;
  thread local_c8;
  ulong local_c0;
  size_t i;
  function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> local_b0;
  anon_class_1_0_00000001 local_8d [8];
  anon_class_1_0_00000001 thread_enter;
  function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> local_80;
  anon_class_1_0_00000001 local_59;
  char **ppcStack_58;
  anon_class_1_0_00000001 thread_exit;
  char **argv_local;
  int argc_local;
  unique_ptr<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
  local_38;
  function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *local_30;
  unique_ptr<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
  local_18;
  function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *local_10;
  
  ppcStack_58 = argv;
  std::function<void(TLS::BASE<tls_data_t,1024u>::data_t&)>::function<main::__0&,void>
            ((function<void(TLS::BASE<tls_data_t,1024u>::data_t&)> *)&local_80,&local_59);
  local_30 = &local_80;
  pfVar3 = (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)operator_new(0x20);
  std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>::function(pfVar3,local_30);
  std::
  unique_ptr<std::function<void(TLS::BASE<tls_data_t,1024u>::data_t&)>,std::default_delete<std::function<void(TLS::BASE<tls_data_t,1024u>::data_t&)>>>
  ::unique_ptr<std::default_delete<std::function<void(TLS::BASE<tls_data_t,1024u>::data_t&)>>,void>
            ((unique_ptr<std::function<void(TLS::BASE<tls_data_t,1024u>::data_t&)>,std::default_delete<std::function<void(TLS::BASE<tls_data_t,1024u>::data_t&)>>>
              *)&local_38,pfVar3);
  std::
  unique_ptr<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
  ::operator=((unique_ptr<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
               *)&TLS::BASE<tls_data_t,1024u>::_details::_thread_exit_callback,&local_38);
  std::
  unique_ptr<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
  ::~unique_ptr(&local_38);
  std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>::~function(&local_80);
  std::function<void(TLS::BASE<tls_data_t,1024u>::data_t&)>::function<main::__1&,void>
            ((function<void(TLS::BASE<tls_data_t,1024u>::data_t&)> *)&local_b0,local_8d);
  local_10 = &local_b0;
  pfVar3 = (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)operator_new(0x20);
  std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>::function(pfVar3,local_10);
  std::
  unique_ptr<std::function<void(TLS::BASE<tls_data_t,1024u>::data_t&)>,std::default_delete<std::function<void(TLS::BASE<tls_data_t,1024u>::data_t&)>>>
  ::unique_ptr<std::default_delete<std::function<void(TLS::BASE<tls_data_t,1024u>::data_t&)>>,void>
            ((unique_ptr<std::function<void(TLS::BASE<tls_data_t,1024u>::data_t&)>,std::default_delete<std::function<void(TLS::BASE<tls_data_t,1024u>::data_t&)>>>
              *)&local_18,pfVar3);
  std::
  unique_ptr<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
  ::operator=((unique_ptr<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
               *)&TLS::BASE<tls_data_t,1024u>::_details::_thread_enter_callback,&local_18);
  std::
  unique_ptr<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
  ::~unique_ptr(&local_18);
  std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>::~function(&local_b0);
  if (main::n_threads == '\0') {
    iVar2 = __cxa_guard_acquire(&main::n_threads);
    if (iVar2 != 0) {
      iVar2 = std::thread::hardware_concurrency();
      main::n_threads = (size_t)(uint)(iVar2 * 5);
      __cxa_guard_release(&main::n_threads);
    }
  }
  if (main::threads == '\0') {
    iVar2 = __cxa_guard_acquire(&main::threads);
    __n = main::n_threads;
    if (iVar2 != 0) {
      std::allocator<std::thread>::allocator((allocator<std::thread> *)((long)&i + 7));
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                (&main::threads,__n,(allocator<std::thread> *)((long)&i + 7));
      std::allocator<std::thread>::~allocator((allocator<std::thread> *)((long)&i + 7));
      __cxa_atexit(std::vector<std::thread,_std::allocator<std::thread>_>::~vector,&main::threads,
                   &__dso_handle);
      __cxa_guard_release(&main::threads);
    }
  }
  local_c0 = 0;
  while( true ) {
    uVar1 = local_c0;
    sVar4 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&main::threads);
    if (sVar4 <= uVar1) break;
    i_1 = (size_t)&local_c0;
    std::thread::thread<main::__2,,void>(&local_c8,(type *)&i_1);
    this = std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                     (&main::threads,local_c0);
    std::thread::operator=(this,&local_c8);
    std::thread::~thread(&local_c8);
    local_c0 = local_c0 + 1;
  }
  local_d8 = 0;
  while( true ) {
    sVar4 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&main::threads);
    if (sVar4 <= local_d8) break;
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&main::threads,local_d8);
    std::thread::join();
    local_d8 = local_d8 + 1;
  }
  printf("n_threads: %u\n",main::n_threads & 0xffffffff);
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	(void)argv;
	(void)argc;

#ifdef TLS_DEBUG_
	tls::debug();
#endif

	auto thread_exit = [](tls::data_t & data) {
		assert(data._data.ptr != nullptr);
		printf("exit:%" PRIxPTR" %p\n", data._id, data._data.ptr);
		delete data._data.ptr;
		data._data.ptr = nullptr;
	};

	// tls::thread_exit() will be call once per thread when it exits - the calling thread will not be the acquire thread
	// try not to do heavy lifting in the callback as it could cause performance problems
	tls::thread_exit(thread_exit);

	auto thread_enter = [](tls::data_t & data) {
		assert(data._data.ptr == nullptr);
		printf("enter:%" PRIxPTR" %p\n", data._id, data._data.ptr);
		data._data.ptr = new int;
	};

	// tls::thread_enter() will be call on the first tls::acquire() once per thread - calling thread will be the aquire thread
	tls::thread_enter(thread_enter);

	static const size_t n_threads = std::thread::hardware_concurrency() * 5;
//	static const size_t n_threads = 1024;
	static std::vector<std::thread> threads(n_threads);

	for (size_t i = 0; i < threads.size(); ++i) {
		threads[i] = std::thread([&] { test(i); });
	}

	for (size_t i = 0; i < threads.size(); ++i) {
		threads[i].join();
	}

	printf("n_threads: %u\n", (uint32_t)n_threads);

	return 0;
}